

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_msg.hxx
# Opt level: O0

void __thiscall
nuraft::req_msg::req_msg
          (req_msg *this,ulong term,msg_type type,int32 src,int32 dst,ulong last_log_term,
          ulong last_log_idx,ulong commit_idx)

{
  int in_ECX;
  msg_type in_EDX;
  ulong in_RSI;
  msg_base *in_RDI;
  int in_R8D;
  _func_int **in_R9;
  ulong in_stack_00000008;
  
  msg_base::msg_base(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D);
  in_RDI->_vptr_msg_base = (_func_int **)&PTR__req_msg_00251180;
  in_RDI[1]._vptr_msg_base = in_R9;
  in_RDI[1].term_ = in_stack_00000008;
  in_RDI[1].type_ = (undefined4)last_log_term;
  in_RDI[1].src_ = last_log_term._4_4_;
  memset(&in_RDI[1].dst_,0,0x18);
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  vector((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          *)0x179cb6);
  return;
}

Assistant:

req_msg(ulong term,
            msg_type type,
            int32 src,
            int32 dst,
            ulong last_log_term,
            ulong last_log_idx,
            ulong commit_idx)
        : msg_base(term, type, src, dst)
        , last_log_term_(last_log_term)
        , last_log_idx_(last_log_idx)
        , commit_idx_(commit_idx)
        , log_entries_()
        { }